

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O2

bool __thiscall
CCoinsViewCache::BatchWrite(CCoinsViewCache *this,CoinsViewCacheCursor *cursor,uint256 *hashBlockIn)

{
  Coin *pCVar1;
  Coin *pCVar2;
  CCoinsMap *this_00;
  byte bVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint8_t flags;
  CoinsCachePair *pCVar8;
  iterator __it;
  size_t sVar9;
  _Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false> _Var10;
  CoinsCachePair *current;
  logic_error *this_01;
  CCoinsCacheEntry *this_02;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false,_false>,_bool>
  pVar11;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar8 = cursor->m_sentinel;
  current = (pCVar8->second).m_next;
  this_00 = &this->cacheCoins;
  do {
    if (current == pCVar8) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
        uVar5 = *(undefined8 *)(hashBlockIn->super_base_blob<256U>).m_data._M_elems;
        uVar6 = *(undefined8 *)((hashBlockIn->super_base_blob<256U>).m_data._M_elems + 8);
        uVar7 = *(undefined8 *)((hashBlockIn->super_base_blob<256U>).m_data._M_elems + 0x18);
        *(undefined8 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 0x10) =
             *(undefined8 *)((hashBlockIn->super_base_blob<256U>).m_data._M_elems + 0x10);
        *(undefined8 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 0x18) = uVar7;
        *(undefined8 *)(this->hashBlock).super_base_blob<256U>.m_data._M_elems = uVar5;
        *(undefined8 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 8) = uVar6;
        return true;
      }
LAB_00a680d6:
      __stack_chk_fail();
    }
    if (((current->second).m_flags & 1) != 0) {
      __it = std::
             _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&this_00->_M_h,&current->first);
      bVar3 = (current->second).m_flags;
      if (__it.super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>._M_cur
          == (__node_type *)0x0) {
        if (((bVar3 & 2) == 0) || ((current->second).coin.out.nValue != -1)) {
          pVar11 = std::
                   unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
                   ::try_emplace<>(this_00,&current->first);
          _Var10 = pVar11.first.
                   super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
                   _M_cur;
          pCVar1 = &(current->second).coin;
          pCVar2 = (Coin *)((long)_Var10.
                                  super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                                  ._M_cur + 0x48);
          if ((cursor->m_will_erase == false) && ((current->second).coin.out.nValue != -1)) {
            Coin::operator=(pCVar2,pCVar1);
          }
          else {
            Coin::operator=(pCVar2,pCVar1);
          }
          pCVar8 = (CoinsCachePair *)
                   ((long)_Var10.
                          super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                          ._M_cur + 8);
          this_02 = (CCoinsCacheEntry *)
                    ((long)_Var10.
                           super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                           ._M_cur + 0x30);
          sVar9 = Coin::DynamicMemoryUsage(pCVar2);
          this->cachedCoinsUsage = this->cachedCoinsUsage + sVar9;
          CCoinsCacheEntry::AddFlags(this_02,'\x01',pCVar8,&this->m_sentinel);
          if (((current->second).m_flags & 2) != 0) {
            flags = '\x02';
            goto LAB_00a67fec;
          }
        }
      }
      else {
        if (((bVar3 & 2) != 0) &&
           (*(long *)((long)__it.
                            super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                            ._M_cur + 0x48) != -1)) {
          this_01 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error
                    (this_01,"FRESH flag misapplied to coin that exists in parent cache");
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
            __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          goto LAB_00a680d6;
        }
        if (((*(byte *)((long)__it.
                              super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                              ._M_cur + 0x40) & 2) == 0) ||
           ((current->second).coin.out.nValue != -1)) {
          pCVar1 = (Coin *)((long)__it.
                                  super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                                  ._M_cur + 0x48);
          sVar9 = Coin::DynamicMemoryUsage(pCVar1);
          this->cachedCoinsUsage = this->cachedCoinsUsage - sVar9;
          pCVar2 = &(current->second).coin;
          if ((cursor->m_will_erase == false) && ((current->second).coin.out.nValue != -1)) {
            Coin::operator=(pCVar1,pCVar2);
          }
          else {
            Coin::operator=(pCVar1,pCVar2);
          }
          pCVar8 = (CoinsCachePair *)
                   ((long)__it.
                          super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                          ._M_cur + 8);
          this_02 = (CCoinsCacheEntry *)
                    ((long)__it.
                           super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                           ._M_cur + 0x30);
          sVar9 = Coin::DynamicMemoryUsage(pCVar1);
          this->cachedCoinsUsage = this->cachedCoinsUsage + sVar9;
          flags = '\x01';
LAB_00a67fec:
          CCoinsCacheEntry::AddFlags(this_02,flags,pCVar8,&this->m_sentinel);
        }
        else {
          sVar9 = Coin::DynamicMemoryUsage
                            ((Coin *)((long)__it.
                                            super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>
                                            ._M_cur + 0x48));
          this->cachedCoinsUsage = this->cachedCoinsUsage - sVar9;
          std::
          _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::erase(&this_00->_M_h,
                  (const_iterator)
                  __it.
                  super__Node_iterator_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>.
                  _M_cur);
        }
      }
    }
    current = CoinsViewCacheCursor::NextAndMaybeErase(cursor,current);
    pCVar8 = cursor->m_sentinel;
  } while( true );
}

Assistant:

bool CCoinsViewCache::BatchWrite(CoinsViewCacheCursor& cursor, const uint256 &hashBlockIn) {
    for (auto it{cursor.Begin()}; it != cursor.End(); it = cursor.NextAndMaybeErase(*it)) {
        // Ignore non-dirty entries (optimization).
        if (!it->second.IsDirty()) {
            continue;
        }
        CCoinsMap::iterator itUs = cacheCoins.find(it->first);
        if (itUs == cacheCoins.end()) {
            // The parent cache does not have an entry, while the child cache does.
            // We can ignore it if it's both spent and FRESH in the child
            if (!(it->second.IsFresh() && it->second.coin.IsSpent())) {
                // Create the coin in the parent cache, move the data up
                // and mark it as dirty.
                itUs = cacheCoins.try_emplace(it->first).first;
                CCoinsCacheEntry& entry{itUs->second};
                if (cursor.WillErase(*it)) {
                    // Since this entry will be erased,
                    // we can move the coin into us instead of copying it
                    entry.coin = std::move(it->second.coin);
                } else {
                    entry.coin = it->second.coin;
                }
                cachedCoinsUsage += entry.coin.DynamicMemoryUsage();
                entry.AddFlags(CCoinsCacheEntry::DIRTY, *itUs, m_sentinel);
                // We can mark it FRESH in the parent if it was FRESH in the child
                // Otherwise it might have just been flushed from the parent's cache
                // and already exist in the grandparent
                if (it->second.IsFresh()) {
                    entry.AddFlags(CCoinsCacheEntry::FRESH, *itUs, m_sentinel);
                }
            }
        } else {
            // Found the entry in the parent cache
            if (it->second.IsFresh() && !itUs->second.coin.IsSpent()) {
                // The coin was marked FRESH in the child cache, but the coin
                // exists in the parent cache. If this ever happens, it means
                // the FRESH flag was misapplied and there is a logic error in
                // the calling code.
                throw std::logic_error("FRESH flag misapplied to coin that exists in parent cache");
            }

            if (itUs->second.IsFresh() && it->second.coin.IsSpent()) {
                // The grandparent cache does not have an entry, and the coin
                // has been spent. We can just delete it from the parent cache.
                cachedCoinsUsage -= itUs->second.coin.DynamicMemoryUsage();
                cacheCoins.erase(itUs);
            } else {
                // A normal modification.
                cachedCoinsUsage -= itUs->second.coin.DynamicMemoryUsage();
                if (cursor.WillErase(*it)) {
                    // Since this entry will be erased,
                    // we can move the coin into us instead of copying it
                    itUs->second.coin = std::move(it->second.coin);
                } else {
                    itUs->second.coin = it->second.coin;
                }
                cachedCoinsUsage += itUs->second.coin.DynamicMemoryUsage();
                itUs->second.AddFlags(CCoinsCacheEntry::DIRTY, *itUs, m_sentinel);
                // NOTE: It isn't safe to mark the coin as FRESH in the parent
                // cache. If it already existed and was spent in the parent
                // cache then marking it FRESH would prevent that spentness
                // from being flushed to the grandparent.
            }
        }
    }
    hashBlock = hashBlockIn;
    return true;
}